

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O3

bool __thiscall Minisat::SimpSolver::merge(SimpSolver *this,Clause *_ps,Clause *_qs,Var v,int *size)

{
  anon_struct_4_5_613047fb_for_header aVar1;
  anon_struct_4_5_613047fb_for_header *paVar2;
  int iVar3;
  Clause CVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  
  this->merges = this->merges + 1;
  paVar2 = &_qs->header;
  aVar1 = _ps->header;
  if ((uint)_ps->header >> 5 < (uint)_qs->header >> 5) {
    paVar2 = &_ps->header;
    aVar1 = _qs->header;
    _ps = _qs;
  }
  iVar5 = ((uint)aVar1 >> 5) - 1;
  *size = iVar5;
  CVar4.header = *paVar2;
  if (0x1f < (uint)CVar4.header) {
    uVar6 = 0;
    do {
      iVar3 = (int)paVar2[uVar6 + 1] >> 1;
      if (iVar3 != v) {
        if (0x1f < (uint)_ps->header) {
          uVar7 = 0;
          do {
            if ((int)(&_ps->header)[uVar7 + 1] >> 1 == iVar3) {
              if (((uint)(&_ps->header)[uVar7 + 1] ^ (uint)paVar2[uVar6 + 1]) == 1) {
                return false;
              }
              goto LAB_0011114e;
            }
            uVar7 = uVar7 + 1;
          } while ((uint)_ps->header >> 5 != uVar7);
        }
        iVar5 = iVar5 + 1;
        *size = iVar5;
        CVar4.header = *paVar2;
      }
LAB_0011114e:
      uVar6 = uVar6 + 1;
    } while (uVar6 < (uint)CVar4.header >> 5);
  }
  return true;
}

Assistant:

bool SimpSolver::merge(const Clause& _ps, const Clause& _qs, Var v, int& size)
{
    merges++;

    bool  ps_smallest = _ps.size() < _qs.size();
    const Clause& ps  =  ps_smallest ? _qs : _ps;
    const Clause& qs  =  ps_smallest ? _ps : _qs;
    const Lit*  __ps  = (const Lit*)ps;
    const Lit*  __qs  = (const Lit*)qs;

    size = ps.size()-1;

    for (int i = 0; i < qs.size(); i++){
        if (var(__qs[i]) != v){
            for (int j = 0; j < ps.size(); j++)
                if (var(__ps[j]) == var(__qs[i])){
                    if (__ps[j] == ~__qs[i])
                        return false;
                    else
                        goto next;
                }
            size++;
        }
        next:;
    }

    return true;
}